

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O0

ostream * glu::detail::operator<<(ostream *str,EnumPointerFmt *fmt)

{
  EnumPointerFmt *stream;
  Enum<int,_4UL> local_38;
  uint local_24;
  EnumPointerFmt *pEStack_20;
  deUint32 ndx;
  EnumPointerFmt *fmt_local;
  ostream *str_local;
  
  pEStack_20 = fmt;
  fmt_local = (EnumPointerFmt *)str;
  if (fmt->value == (deUint32 *)0x0) {
    str_local = std::operator<<(str,"(null)");
  }
  else {
    std::operator<<(str,"{ ");
    for (local_24 = 0; local_24 < pEStack_20->size; local_24 = local_24 + 1) {
      if (local_24 != 0) {
        std::operator<<((ostream *)fmt_local,", ");
      }
      stream = fmt_local;
      tcu::Format::Enum<int,_4UL>::Enum(&local_38,pEStack_20->getName,pEStack_20->value[local_24]);
      tcu::Format::operator<<((ostream *)stream,&local_38);
    }
    std::operator<<((ostream *)fmt_local," }");
    str_local = (ostream *)fmt_local;
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const EnumPointerFmt& fmt)
{
	if (fmt.value)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			// use storage size (4) as print width for clarity
			str << tcu::Format::Enum<int, 4>(fmt.getName, fmt.value[ndx]);
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}